

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall wabt::Var::Var(Var *this,Var *rhs)

{
  *(undefined8 *)((long)&(this->loc).filename.size_ + 4) = 0;
  *(undefined8 *)((long)&(this->loc).field_1.field_1.offset + 4) = 0;
  (this->loc).filename.data_ = (char *)0x0;
  (this->loc).filename.size_ = 0;
  this->type_ = Index;
  (this->field_2).index_ = 0xffffffff;
  operator=(this,rhs);
  return;
}

Assistant:

Var::Var(Var&& rhs) : Var(kInvalidIndex) {
  *this = std::move(rhs);
}